

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokth.c
# Opt level: O2

int tokthscan(tokthdef *tab,uint hash,_func_int_void_ptr_toksdef_ptr_mcmon *cb,void *cbctx)

{
  mcmon *pmVar1;
  mcmcxdef *ctx;
  int iVar2;
  mcmcxdef *pmVar3;
  uint uVar4;
  mcmon mVar5;
  mcmon objnum;
  mcmon obj;
  
  ctx = tab->tokthmem;
  objnum = tab->tokthhsh[hash].tokthpobj;
  uVar4 = tab->tokthhsh[hash].tokthpofs;
  mVar5 = objnum;
  obj = objnum;
  pmVar3 = ctx;
  if (objnum == 0xffff) goto LAB_00117198;
  do {
    pmVar3 = (mcmcxdef *)mcmlck(ctx,objnum);
    mVar5 = objnum;
    obj = objnum;
LAB_00117198:
    do {
      if (mVar5 == 0xffff) {
        iVar2 = 0;
        if (obj == 0xffff) {
          return 0;
        }
LAB_001171fc:
        mcmunlck(ctx,obj);
        return iVar2;
      }
      pmVar1 = (mcmon *)((long)pmVar3->mcmcxmtb + ((ulong)uVar4 - 0x30));
      objnum = *pmVar1;
      uVar4 = *(uint *)(pmVar1 + 2);
      iVar2 = (*cb)(cbctx,(toksdef *)(pmVar1 + 4),mVar5);
      if (iVar2 != 0) {
        iVar2 = 1;
        obj = mVar5;
        goto LAB_001171fc;
      }
      mVar5 = objnum;
    } while (objnum == 0xffff || objnum == obj);
    mcmunlck(ctx,obj);
  } while( true );
}

Assistant:

static int tokthscan(tokthdef *tab, uint hash,
                     int (*cb)(void *, toksdef *, mcmon), 
                     void *cbctx)
{
    tokshdef  *symh;
    toksdef   *sym;
    tokthpdef  p;
    tokthpdef  nxt;
    uchar     *pg;
    mcmcxdef  *mctx = tab->tokthmem;
    mcmon      curobj;

    /* get first object, and lock its page if there is one */
    OSCPYSTRUCT(p, tab->tokthhsh[hash]);
    if ((curobj = p.tokthpobj) != MCMONINV)
        pg = mcmlck(mctx, curobj);

    /* look for a match using the callback */
    for ( ; p.tokthpobj != MCMONINV ; OSCPYSTRUCT(p, nxt))
    {
        symh = (tokshdef *)(pg + p.tokthpofs);
        sym = &symh->tokshsc;
        OSCPYSTRUCT(nxt, symh->tokshnxt);

        /* check for a match; copy to return buffer if found */
        if ((*cb)(cbctx, sym, p.tokthpobj))
        {
            mcmunlck(mctx, p.tokthpobj);
            return(TRUE);
        }
        
        /* if the next page is different from this one, get new lock */
        if (nxt.tokthpobj != curobj && nxt.tokthpobj != MCMONINV)
        {
            mcmunlck(mctx, curobj);
            curobj = nxt.tokthpobj;
            pg = mcmlck(mctx, curobj);
        }
    }

    /* unlock last object, if we had a lock at all */
    if (curobj != MCMONINV) mcmunlck(mctx, curobj);
    return(FALSE);
}